

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O2

void __thiscall
OpenMD::MatrixAccumulator::get95percentConfidenceInterval(MatrixAccumulator *this,ResultType *ret)

{
  size_t sVar1;
  uint i;
  long lVar2;
  uint j;
  long lVar3;
  double (*this_00) [3];
  Mat3x3d sd;
  double local_60 [9];
  
  this_00 = (double (*) [3])local_60;
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)this_00);
  getStdDev(this,(ResultType *)this_00);
  sVar1 = (this->super_BaseAccumulator).Count_;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      (((SquareMatrix<double,_3> *)*(double (*) [3])ret)->super_RectMatrix<double,_3U,_3U>).data_[0]
      [lVar3] = (((RectMatrix<double,_3U,_3U> *)*this_00)->data_[0][lVar3] * 1.96) /
                SQRT(((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
    }
    this_00 = this_00 + 1;
    ret = (ResultType *)((long)ret + 0x18);
  }
  return;
}

Assistant:

void get95percentConfidenceInterval(ResultType& ret) {
      assert(Count_ != 0);
      Mat3x3d sd;
      this->getStdDev(sd);
      for (unsigned int i = 0; i < 3; i++) {
        for (unsigned int j = 0; j < 3; j++) {
          ret(i, j) = 1.960 * sd(i, j) / sqrt(RealType(Count_));
        }
      }
      return;
    }